

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void Catch::anon_unknown_26::listListeners(IEventListener *reporter)

{
  bool bVar1;
  int iVar2;
  IRegistryHub *pIVar3;
  undefined4 extraout_var;
  vector<Catch::Detail::unique_ptr<Catch::EventListenerFactory>,_std::allocator<Catch::Detail::unique_ptr<Catch::EventListenerFactory>_>_>
  *this;
  size_type __n;
  EventListenerFactory *pEVar4;
  undefined4 extraout_var_00;
  value_type local_90;
  reference local_60;
  unique_ptr<Catch::EventListenerFactory> *fac;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Catch::Detail::unique_ptr<Catch::EventListenerFactory>,_std::allocator<Catch::Detail::unique_ptr<Catch::EventListenerFactory>_>_>
  *__range2;
  vector<Catch::Detail::unique_ptr<Catch::EventListenerFactory>,_std::allocator<Catch::Detail::unique_ptr<Catch::EventListenerFactory>_>_>
  *factories;
  vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_> descriptions;
  IEventListener *reporter_local;
  
  descriptions.
  super__Vector_base<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)reporter;
  std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>::vector
            ((vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_> *)
             &factories);
  pIVar3 = getRegistryHub();
  iVar2 = (*pIVar3->_vptr_IRegistryHub[2])();
  this = ReporterRegistry::getListeners((ReporterRegistry *)CONCAT44(extraout_var,iVar2));
  __n = std::
        vector<Catch::Detail::unique_ptr<Catch::EventListenerFactory>,_std::allocator<Catch::Detail::unique_ptr<Catch::EventListenerFactory>_>_>
        ::size(this);
  std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>::reserve
            ((vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_> *)
             &factories,__n);
  __end2 = std::
           vector<Catch::Detail::unique_ptr<Catch::EventListenerFactory>,_std::allocator<Catch::Detail::unique_ptr<Catch::EventListenerFactory>_>_>
           ::begin(this);
  fac = (unique_ptr<Catch::EventListenerFactory> *)
        std::
        vector<Catch::Detail::unique_ptr<Catch::EventListenerFactory>,_std::allocator<Catch::Detail::unique_ptr<Catch::EventListenerFactory>_>_>
        ::end(this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_Catch::Detail::unique_ptr<Catch::EventListenerFactory>_*,_std::vector<Catch::Detail::unique_ptr<Catch::EventListenerFactory>,_std::allocator<Catch::Detail::unique_ptr<Catch::EventListenerFactory>_>_>_>
                                *)&fac);
    if (!bVar1) break;
    local_60 = __gnu_cxx::
               __normal_iterator<const_Catch::Detail::unique_ptr<Catch::EventListenerFactory>_*,_std::vector<Catch::Detail::unique_ptr<Catch::EventListenerFactory>,_std::allocator<Catch::Detail::unique_ptr<Catch::EventListenerFactory>_>_>_>
               ::operator*(&__end2);
    pEVar4 = Detail::unique_ptr<Catch::EventListenerFactory>::operator->(local_60);
    iVar2 = (*pEVar4->_vptr_EventListenerFactory[3])();
    local_90.name.m_start = (char *)CONCAT44(extraout_var_00,iVar2);
    pEVar4 = Detail::unique_ptr<Catch::EventListenerFactory>::operator->(local_60);
    (*pEVar4->_vptr_EventListenerFactory[4])(&local_90.description);
    std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>::push_back
              ((vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_> *)
               &factories,&local_90);
    ListenerDescription::~ListenerDescription(&local_90);
    __gnu_cxx::
    __normal_iterator<const_Catch::Detail::unique_ptr<Catch::EventListenerFactory>_*,_std::vector<Catch::Detail::unique_ptr<Catch::EventListenerFactory>,_std::allocator<Catch::Detail::unique_ptr<Catch::EventListenerFactory>_>_>_>
    ::operator++(&__end2);
  }
  (**(code **)(((descriptions.
                 super__Vector_base<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->name).m_start + 0xa8))
            (descriptions.
             super__Vector_base<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,&factories);
  std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>::~vector
            ((vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_> *)
             &factories);
  return;
}

Assistant:

void listListeners(IEventListener& reporter) {
            std::vector<ListenerDescription> descriptions;

            auto const& factories =
                getRegistryHub().getReporterRegistry().getListeners();
            descriptions.reserve( factories.size() );
            for ( auto const& fac : factories ) {
                descriptions.push_back( { fac->getName(), fac->getDescription() } );
            }

            reporter.listListeners( descriptions );
        }